

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O2

void __thiscall
ECdecoding::queueCheck(ECdecoding *this,array<double,_2UL> *fanoMetrics,array<char,_4UL> *bases)

{
  btree_multiset<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>_>
  *this_00;
  json *this_01;
  unsigned_long lhs;
  pointer pSVar1;
  bool bVar2;
  reference puVar3;
  reference pvVar4;
  ostream *poVar5;
  logic_error *this_02;
  array<double,_2UL> *fanoMetrics_00;
  int iVar6;
  pointer bestSequence;
  double dVar7;
  iterator iVar8;
  iterator iter;
  const_iterator first;
  const_iterator last;
  btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
  local_98;
  vector<SeqEntry,_std::allocator<SeqEntry>_> seqEvals;
  char2double nextProbs;
  
  seqEvals.super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = &this->queue;
  seqEvals.super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  seqEvals.super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  iVar8 = absl::container_internal::
          btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
          ::begin((btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                   *)this_00);
  local_98.node_ = iVar8.node_;
  local_98.position_ = iVar8.position_;
  puVar3 = absl::container_internal::
           btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
           ::operator*(&local_98);
  std::vector<SeqEntry,_std::allocator<SeqEntry>_>::push_back
            (&seqEvals,
             (puVar3->_M_t).super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
             super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
             super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl);
  iVar8.position_ = local_98.position_;
  iVar8.node_ = local_98.node_;
  iVar8._12_4_ = 0;
  absl::container_internal::
  btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  ::erase((btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
           *)this_00,iVar8);
  this_01 = &this->config;
  iVar6 = 0;
  while ((this->queue).
         super_btree_multiset_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
         .
         super_btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
         .tree_.size_ != 0) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)this_01,"decode");
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar4,"threshold");
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar4,"loop");
    bVar2 = nlohmann::operator<<int,_0>(iVar6,pvVar4);
    if (!bVar2) break;
    iVar8 = absl::container_internal::
            btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
            ::begin((btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                     *)this_00);
    local_98.node_ = iVar8.node_;
    local_98.position_ = iVar8.position_;
    puVar3 = absl::container_internal::
             btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
             ::operator*(&local_98);
    if ((((puVar3->_M_t).super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
          super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
          super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl)->seq)._M_string_length ==
        (ulong)this->messageLen) break;
    puVar3 = absl::container_internal::
             btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
             ::operator*(&local_98);
    std::vector<SeqEntry,_std::allocator<SeqEntry>_>::push_back
              (&seqEvals,
               (puVar3->_M_t).super___uniq_ptr_impl<SeqEntry,_std::default_delete<SeqEntry>_>._M_t.
               super__Tuple_impl<0UL,_SeqEntry_*,_std::default_delete<SeqEntry>_>.
               super__Head_base<0UL,_SeqEntry_*,_false>._M_head_impl);
    iter.position_ = local_98.position_;
    iter.node_ = local_98.node_;
    iter._12_4_ = 0;
    absl::container_internal::
    btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
    ::erase((btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
             *)this_00,iter);
    iVar6 = iVar6 + 1;
  }
  pSVar1 = seqEvals.super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (bestSequence = seqEvals.super__Vector_base<SeqEntry,_std::allocator<SeqEntry>_>._M_impl.
                      super__Vector_impl_data._M_start; bestSequence != pSVar1;
      bestSequence = bestSequence + 1) {
    calcNextProbs(&nextProbs,this,bestSequence);
    metricProbs(this,bestSequence,fanoMetrics_00,&nextProbs,bases);
    robin_hood::detail::
    Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::destroy
              (&nextProbs);
  }
  lhs = (this->queue).
        super_btree_multiset_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
        .
        super_btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
        .tree_.size_;
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)this_01,"decode");
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar4,"queue");
  pvVar4 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       *)pvVar4,"size");
  bVar2 = nlohmann::operator><unsigned_long,_0>(lhs,pvVar4);
  if (bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cout,"[!] ");
    poVar5 = std::operator<<(poVar5,"reached max queue size.");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar6 = this->queueCounter + 1;
    this->queueCounter = iVar6;
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)this_01,"decode");
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar4,"queue");
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar4,"runs");
    bVar2 = nlohmann::operator><int,_0>(iVar6,pvVar4);
    if (bVar2) {
      this_02 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_02,"maximum queue counter reached.");
      __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    iVar8 = absl::container_internal::
            btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
            ::begin((btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                     *)this_00);
    nextProbs.mHashMultiplier = (uint64_t)iVar8.node_;
    nextProbs.mKeyVals._0_4_ = iVar8.position_;
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)this_01,"decode");
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar4,"queue");
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar4,"size");
    iVar6 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<int,_0>(pvVar4);
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)this_01,"decode");
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar4,"queue");
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar4,"reduce");
    dVar7 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<double,_0>(pvVar4);
    std::
    advance<absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>&,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>*>,int>
              ((btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
                *)&nextProbs,(int)(dVar7 * (double)iVar6));
    first.position_ = (int)nextProbs.mKeyVals;
    first.node_ = (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                   *)nextProbs.mHashMultiplier;
    iVar8 = absl::container_internal::
            btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
            ::end((btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                   *)this_00);
    first._12_4_ = 0;
    last._12_4_ = 0;
    last.node_ = (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                  *)SUB128(iVar8._0_12_,0);
    last.position_ = SUB124(iVar8._0_12_,8);
    absl::container_internal::
    btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
    ::erase((btree_container<absl::container_internal::btree<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>_>
             *)this_00,first,last);
  }
  std::vector<SeqEntry,_std::allocator<SeqEntry>_>::~vector(&seqEvals);
  return;
}

Assistant:

void ECdecoding::queueCheck(array<double, 2> &fanoMetrics, array<char, 4> &bases) {
    vector<SeqEntry> seqEvals;
    auto itr = queue.begin();
    seqEvals.push_back(**itr);
    queue.erase(itr);
    int counter = 0;
    while (!queue.empty() && counter < config["decode"]["threshold"]["loop"]) {
        itr = queue.begin();
        if ((**itr).seq.size() == messageLen)
            break;
        seqEvals.push_back(**itr);
        queue.erase(itr);
        counter++;
    }

    for (auto &seqEntry: seqEvals) {
        char2double nextProbs = calcNextProbs(seqEntry);
        metricProbs(seqEntry, fanoMetrics, nextProbs, bases);
    }
    if (queue.size() > config["decode"]["queue"]["size"]) {
        WARN("reached max queue size.");
        queueCounter++;
        if (queueCounter > config["decode"]["queue"]["runs"]) { //8 5
            throw logic_error("maximum queue counter reached.");
        }
        auto delete_itr = queue.begin();
        int reduce_to =  static_cast<int>( static_cast<int>( config["decode"]["queue"]["size"])*static_cast<double>( config["decode"]["queue"]["reduce"]));
        advance(delete_itr, reduce_to);
        queue.erase(delete_itr, queue.end());
    }
}